

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O2

void __thiscall
TTD::SnapShot::EmitSnapshot(SnapShot *this,int64 snapId,ThreadContext *threadContext)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  JsTTDStreamHandle handle;
  char local_c8 [8];
  char asciiResourceName [64];
  TextFormatWriter snapwriter;
  
  sprintf_s(local_c8,0x40,"snap_%I64i.snp",snapId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar4 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar5 = strlen(local_c8);
  handle = (*p_Var2)(sVar3,pcVar4,sVar5,local_c8,false,true);
  if (handle != (JsTTDStreamHandle)0x0) {
    TextFormatWriter::TextFormatWriter
              ((TextFormatWriter *)(asciiResourceName + 0x38),handle,
               (pTVar1->TTDataIOInfo).pfWriteBytesToStream,
               (pTVar1->TTDataIOInfo).pfFlushAndCloseStream);
    EmitSnapshotToFile(this,(FileWriter *)(asciiResourceName + 0x38),threadContext);
    FileWriter::FlushAndClose((FileWriter *)(asciiResourceName + 0x38));
    TextFormatWriter::~TextFormatWriter((TextFormatWriter *)(asciiResourceName + 0x38));
    return;
  }
  TTDAbort_unrecoverable_error("Failed to open snapshot resource stream for writing.");
}

Assistant:

void SnapShot::EmitSnapshot(int64 snapId, ThreadContext* threadContext) const
    {
        char asciiResourceName[64];
        sprintf_s(asciiResourceName, 64, "snap_%I64i.snp", snapId);

        TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
        JsTTDStreamHandle snapHandle = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, false, true);
        TTDAssert(snapHandle != nullptr, "Failed to open snapshot resource stream for writing.");

        TTD_SNAP_WRITER snapwriter(snapHandle, iofp.pfWriteBytesToStream, iofp.pfFlushAndCloseStream);

        this->EmitSnapshotToFile(&snapwriter, threadContext);
        snapwriter.FlushAndClose();
    }